

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

void Gia_ManFilterEquivsUsingLatches
               (Gia_Man_t *pGia,int fFlopsOnly,int fFlopsWith,int fUseRiDrivers)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Rpr_t GVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  bool bVar10;
  Vec_Int_t *p;
  int *piVar11;
  void *__s;
  ulong uVar12;
  ulong uVar13;
  uint *puVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  Gia_Rpr_t *pGVar19;
  long lVar20;
  uint uVar21;
  
  if (fFlopsOnly == fFlopsWith) {
    __assert_fail("fFlopsOnly ^ fFlopsWith",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x9c1,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar11 = (int *)malloc(400);
  p->pArray = piVar11;
  uVar2 = pGia->nObjs;
  uVar16 = (ulong)uVar2;
  uVar21 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar21 = uVar2;
  }
  if ((uVar21 == 0) || (__s = malloc((long)(int)uVar21 << 2), __s == (void *)0x0)) {
    __s = (void *)0x0;
  }
  else {
    memset(__s,0,(long)(int)uVar2 << 2);
  }
  iVar3 = pGia->nRegs;
  if (fUseRiDrivers == 0) {
    if (0 < iVar3) {
      pVVar8 = pGia->vCis;
      iVar18 = 0;
      do {
        iVar4 = pVVar8->nSize;
        uVar21 = (iVar18 - iVar3) + iVar4;
        if (((int)uVar21 < 0) || (iVar4 <= (int)uVar21)) goto LAB_00205116;
        iVar4 = pVVar8->pArray[uVar21];
        if (((long)iVar4 < 0) || ((int)uVar2 <= iVar4)) goto LAB_00205154;
        if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
        *(undefined4 *)((long)__s + (long)iVar4 * 4) = 1;
        iVar18 = iVar18 + 1;
      } while (iVar18 < iVar3);
    }
  }
  else if (0 < iVar3) {
    pVVar8 = pGia->vCos;
    iVar18 = 0;
    do {
      iVar4 = pVVar8->nSize;
      uVar21 = (iVar18 - iVar3) + iVar4;
      if (((int)uVar21 < 0) || (iVar4 <= (int)uVar21)) goto LAB_00205116;
      iVar4 = pVVar8->pArray[uVar21];
      if (((long)iVar4 < 0) || ((int)uVar2 <= iVar4)) {
LAB_00205154:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      uVar21 = iVar4 - (*(uint *)(pGia->pObjs + iVar4) & 0x1fffffff);
      if (((int)uVar21 < 0) || (uVar2 <= uVar21)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)((long)__s + (ulong)uVar21 * 4) = 1;
      iVar18 = iVar18 + 1;
    } while (iVar18 < iVar3);
  }
  uVar17 = 0;
  uVar21 = 0;
  uVar12 = uVar16;
  if (1 < (int)uVar2) {
    uVar21 = 0;
    uVar13 = 1;
    uVar17 = 0;
    do {
      GVar5 = pGia->pReprs[uVar13];
      if (((uint)GVar5 & 0xfffffff) == 0) {
        if (pGia->pNexts[uVar13] != 0) {
          __assert_fail("pGia->pNexts[i] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x9d3,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
        }
        if (uVar16 <= uVar13) {
LAB_00205116:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar17 = uVar17 + 1;
        if (*(int *)((long)__s + uVar13 * 4) == 0) {
          pGia->pReprs[uVar13] = (Gia_Rpr_t)((uint)GVar5 | 0xfffffff);
          uVar12 = (ulong)(uint)pGia->nObjs;
        }
        else {
          uVar21 = uVar21 + 1;
        }
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)(int)uVar12);
  }
  if (fFlopsOnly == 0) {
    if (1 < (int)uVar12) {
      pGVar19 = pGia->pReprs;
      uVar16 = 1;
      do {
        if (((~(uint)pGVar19[uVar16] & 0xfffffff) == 0) &&
           (piVar9 = pGia->pNexts, 0 < piVar9[uVar16])) {
          puVar14 = (uint *)(piVar9 + uVar16);
          uVar17 = uVar17 - 1;
          bVar10 = false;
          uVar13 = uVar16 & 0xffffffff;
          uVar6 = uVar21 - 1;
          uVar15 = uVar21;
          do {
            uVar15 = uVar15 + 1;
            if ((int)uVar2 <= (int)uVar13) goto LAB_00205116;
            if (*(int *)((long)__s + uVar13 * 4) != 0) {
              bVar10 = true;
            }
            puVar1 = (uint *)(piVar9 + uVar13);
            uVar13 = (ulong)*puVar1;
            uVar21 = uVar6 + 1;
            uVar17 = uVar17 + 1;
            uVar6 = uVar21;
          } while (0 < (int)*puVar1);
          if (!bVar10) {
            uVar12 = uVar16 & 0xffffffff;
            uVar21 = uVar15;
            do {
              uVar6 = *puVar14;
              pGia->pReprs[(int)uVar12] = (Gia_Rpr_t)((uint)pGia->pReprs[(int)uVar12] | 0xfffffff);
              uVar21 = uVar21 - 1;
              piVar9 = pGia->pNexts;
              piVar9[(int)uVar12] = 0;
              puVar14 = (uint *)(piVar9 + (int)uVar6);
              uVar12 = (ulong)uVar6;
            } while ((long)(int)uVar6 != 0);
            pGVar19 = pGia->pReprs;
            if (((~(uint)pGVar19[uVar16] & 0xfffffff) == 0) && (0 < piVar9[uVar16])) {
              __assert_fail("!Gia_ObjIsHead(pGia, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                            ,0xa16,
                            "void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
            }
            uVar12 = (ulong)(uint)pGia->nObjs;
          }
        }
        uVar16 = uVar16 + 1;
      } while ((long)uVar16 < (long)(int)uVar12);
    }
  }
  else if (1 < (int)uVar12) {
    uVar16 = 1;
    do {
      if (((~(uint)pGia->pReprs[uVar16] & 0xfffffff) == 0) &&
         (piVar11 = pGia->pNexts, 0 < piVar11[uVar16])) {
        p->nSize = 0;
        uVar17 = uVar17 - 1;
        uVar12 = uVar16 & 0xffffffff;
        do {
          if ((int)uVar2 <= (int)uVar12) goto LAB_00205116;
          if (*(int *)((long)__s + uVar12 * 4) != 0) {
            Vec_IntPush(p,(int)uVar12);
            piVar11 = pGia->pNexts;
          }
          puVar14 = (uint *)(piVar11 + uVar12);
          uVar12 = (ulong)*puVar14;
          uVar17 = uVar17 + 1;
        } while (0 < (int)*puVar14);
        puVar14 = (uint *)(piVar11 + uVar16);
        uVar12 = uVar16 & 0xffffffff;
        do {
          uVar6 = *puVar14;
          pGia->pReprs[(int)uVar12] = (Gia_Rpr_t)((uint)pGia->pReprs[(int)uVar12] | 0xfffffff);
          piVar11 = pGia->pNexts;
          piVar11[(int)uVar12] = 0;
          puVar14 = (uint *)(piVar11 + (int)uVar6);
          uVar12 = (ulong)uVar6;
        } while ((long)(int)uVar6 != 0);
        if (((~(uint)pGia->pReprs[uVar16] & 0xfffffff) == 0) && (0 < piVar11[uVar16])) {
          __assert_fail("!Gia_ObjIsHead(pGia, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x9ed,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
        }
        iVar3 = p->nSize;
        if (1 < (long)iVar3) {
          puVar14 = (uint *)p->pArray;
          uVar6 = *puVar14;
          uVar21 = (uVar21 + iVar3) - 1;
          lVar20 = 1;
          uVar15 = uVar6;
          do {
            uVar7 = puVar14[lVar20];
            if ((uVar6 != 0xfffffff) && ((int)uVar7 <= (int)uVar6)) {
              __assert_fail("Num == GIA_VOID || Num < Id",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x401,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
            }
            pGia->pReprs[(int)uVar7] =
                 (Gia_Rpr_t)((uint)pGia->pReprs[(int)uVar7] & 0xf0000000 | uVar6 & 0xfffffff);
            piVar11 = pGia->pNexts;
            piVar11[(int)uVar15] = uVar7;
            lVar20 = lVar20 + 1;
            uVar15 = uVar7;
          } while (iVar3 != lVar20);
          if (piVar11[(int)uVar7] != 0) {
            __assert_fail("Gia_ObjNext(pGia, iPrev) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                          ,0x9f9,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)")
            ;
          }
        }
      }
      uVar16 = uVar16 + 1;
    } while ((long)uVar16 < (long)pGia->nObjs);
    piVar11 = p->pArray;
  }
  if (piVar11 != (int *)0x0) {
    free(piVar11);
  }
  free(p);
  if (__s != (void *)0x0) {
    free(__s);
  }
  Abc_Print(1,"The number of literals: Before = %d. After = %d.\n",(ulong)uVar17,(ulong)uVar21);
  return;
}

Assistant:

void Gia_ManFilterEquivsUsingLatches( Gia_Man_t * pGia, int fFlopsOnly, int fFlopsWith, int fUseRiDrivers )
{
    Gia_Obj_t * pObjR;
    Vec_Int_t * vNodes, * vFfIds;
    int i, k, iObj, iNext, iPrev, iRepr;
    int iLitsOld = 0, iLitsNew = 0;
    assert( fFlopsOnly ^ fFlopsWith );
    vNodes = Vec_IntAlloc( 100 );
    // select nodes "flop" node IDs
    vFfIds = Vec_IntStart( Gia_ManObjNum(pGia) );
    if ( fUseRiDrivers )
    {
        Gia_ManForEachRi( pGia, pObjR, i )
            Vec_IntWriteEntry( vFfIds, Gia_ObjFaninId0p(pGia, pObjR), 1 );
    }
    else
    {
        Gia_ManForEachRo( pGia, pObjR, i )
            Vec_IntWriteEntry( vFfIds, Gia_ObjId(pGia, pObjR), 1 );
    }
    // remove all non-flop constants
    Gia_ManForEachConst( pGia, i )
    {
        iLitsOld++;
        assert( pGia->pNexts[i] == 0 );
        if ( !Vec_IntEntry(vFfIds, i) )
            Gia_ObjUnsetRepr( pGia, i );
        else
            iLitsNew++;
    }
    // clear the classes
    if ( fFlopsOnly )
    {
        Gia_ManForEachClass( pGia, i )
        {
            Vec_IntClear( vNodes );
            Gia_ClassForEachObj( pGia, i, iObj )
            {
                if ( Vec_IntEntry(vFfIds, iObj) )
                    Vec_IntPush( vNodes, iObj );
                iLitsOld++;
            }
            iLitsOld--;
            // undo equivalence classes
            for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
                  iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
            {
                Gia_ObjUnsetRepr( pGia, iObj );
                Gia_ObjSetNext( pGia, iObj, 0 );
            }
            assert( !Gia_ObjIsHead(pGia, i) );
            if ( Vec_IntSize(vNodes) > 1 )
            {
                // create new class
                iPrev = iRepr = Vec_IntEntry( vNodes, 0 );
                Vec_IntForEachEntryStart( vNodes, iObj, k, 1 )
                {
                    Gia_ObjSetRepr( pGia, iObj, iRepr );
                    Gia_ObjSetNext( pGia, iPrev, iObj );
                    iPrev = iObj;
                    iLitsNew++;
                }
                assert( Gia_ObjNext(pGia, iPrev) == 0 );
            }
        }
    }
    else
    {
        Gia_ManForEachClass( pGia, i )
        {
            int fSeenFlop = 0;
            Gia_ClassForEachObj( pGia, i, iObj )
            {
                if ( Vec_IntEntry(vFfIds, iObj) )
                    fSeenFlop = 1;
                iLitsOld++;
                iLitsNew++;
            }
            iLitsOld--;
            iLitsNew--;
            if ( fSeenFlop )
                continue;
            // undo equivalence classes
            for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
                  iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
            {
                Gia_ObjUnsetRepr( pGia, iObj );
                Gia_ObjSetNext( pGia, iObj, 0 );
                iLitsNew--;
            }
            iLitsNew++;
            assert( !Gia_ObjIsHead(pGia, i) );
        }
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vFfIds );
    Abc_Print( 1, "The number of literals: Before = %d. After = %d.\n", iLitsOld, iLitsNew );
}